

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O2

void __thiscall
so_5::impl::disp_repository_t::disp_repository_t
          (disp_repository_t *this,environment_t *env,named_dispatcher_map_t *named_dispatcher_map,
          event_exception_logger_unique_ptr_t *logger)

{
  this->_vptr_disp_repository_t = (_func_int **)&PTR__disp_repository_t_002c8638;
  this->m_env = env;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header,
             &(named_dispatcher_map->_M_t)._M_impl.super__Rb_tree_header);
  (this->m_exception_logger_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_exception_logger_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_exception_logger_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_exception_logger_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_exception_logger_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_event_exception_logger)._M_t.
  super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
  .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
       (logger->_M_t).
       super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
       .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl;
  (logger->_M_t).
  super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
  .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
       (event_exception_logger_t *)0x0;
  this->m_state = not_started;
  (this->m_lock).m_counters.super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

disp_repository_t::disp_repository_t(
	environment_t & env,
	named_dispatcher_map_t named_dispatcher_map,
	event_exception_logger_unique_ptr_t logger )
	:	m_env( env )
	,	m_named_dispatcher_map( std::move( named_dispatcher_map ) )
	,	m_event_exception_logger( std::move( logger ) )
	,	m_state( state_t::not_started )
{
}